

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_Invert(InvertForm1 Invert)

{
  byte value;
  bool bVar1;
  Image output;
  Image input;
  ImageTemplate<unsigned_char> local_68;
  Image local_40;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_68,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_40,value,0,0,&local_68);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  (*Invert)(&local_68,&local_40);
  bVar1 = Unit_Test::verifyImage(&local_68,~value);
  local_68._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_68);
  local_40._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_40);
  return bVar1;
}

Assistant:

bool form1_Invert(InvertForm1 Invert)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const PenguinV_Image::Image output = Invert( input );

        return verifyImage( output, ~intensity );
    }